

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

size_t next_pow2(size_t x)

{
  undefined8 local_18;
  int i;
  size_t x_local;
  
  i = 0;
  if (x == 0) {
    local_18 = 0;
  }
  else {
    local_18 = x - 1;
  }
  for (x_local = local_18; x_local != 0; x_local = x_local >> 1) {
    i = i + 1;
  }
  return 1L << ((byte)i & 0x3f);
}

Assistant:

size_t next_pow2(size_t x)
{
  int i = 0;
  x = x > 0 ? x - 1 : 0;
  while (x > 0)
  {
    x >>= 1;
    i++;
  }
  return ((size_t)1) << i;
}